

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O2

void __thiscall TURBOLINECOUNT::CLineCount::~CLineCount(CLineCount *this)

{
  if ((this->m_auto_close == true) && (this->m_opened == true)) {
    ::close(this->m_fh);
  }
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&(this->m_threadlinecounts).super__Vector_base<long,_std::allocator<long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_threads).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::__cxx11::string::~string((string *)&this->m_lasterrorstring);
  return;
}

Assistant:

CLineCount::~CLineCount()
{
	if (m_auto_close && m_opened)
	{
		LCCLOSEFILE(m_fh);
	}
}